

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

int Lodtalk::Float::stDiv(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  double dVar7;
  double dVar8;
  ulong *puVar4;
  ulong *puVar5;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  puVar4 = (ulong *)CONCAT44(extraout_var_00,uVar2);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  puVar5 = (ulong *)CONCAT44(extraout_var_01,uVar3);
  if (((((uVar2 & 1) == 0) && ((uVar2 & 6) != 4)) &&
      (((uVar2 & 6) != 0 || ((uint)(*puVar4 >> 0x2a) != 0x22)))) ||
     ((((uVar3 & 1) == 0 && ((uVar3 & 6) != 4)) &&
      (((uVar3 & 6) != 0 || ((uint)(*puVar5 >> 0x2a) != 0x22)))))) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 6) == 4) {
      uVar6 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
      dVar7 = (double)(uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f);
    }
    else {
      if (((uVar2 & 6) != 0) || ((uint)(*puVar4 >> 0x2a) != 0x22)) goto LAB_00142161;
      if ((*puVar4 & 0xfffffc0000000000) != 0x880000000000) goto LAB_00142180;
      dVar7 = (double)puVar4[1];
    }
  }
  else {
    dVar7 = (double)((long)puVar4 >> 1);
  }
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 6) == 4) {
      uVar6 = ((ulong)puVar5 >> 3) + 0x7000000000000000;
      dVar8 = (double)(uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f);
    }
    else {
      if (((uVar3 & 6) != 0) || ((uint)(*puVar5 >> 0x2a) != 0x22)) {
LAB_00142161:
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      if ((*puVar5 & 0xfffffc0000000000) != 0x880000000000) {
LAB_00142180:
        __assert_fail("isFloat()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x216,"double Lodtalk::Oop::decodeFloat() const");
      }
      dVar8 = (double)puVar5[1];
    }
  }
  else {
    dVar8 = (double)((long)puVar5 >> 1);
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x14])(dVar7 / dVar8,interpreter);
  return iVar1;
}

Assistant:

int Float::stDiv(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isFloatOrInt() || !b.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fa = a.decodeFloatOrInt();
    auto fb = b.decodeFloatOrInt();
    return interpreter->returnFloat(fa / fb);
}